

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetImageWidget.cpp
# Opt level: O0

TargetImageWidget * __thiscall TargetImageWidget::GetImageInViewTargetArea(TargetImageWidget *this)

{
  int *piVar1;
  TargetImageWidget *in_RSI;
  QRectF local_98;
  QPointF local_78;
  QPointF local_68;
  double local_58;
  qreal scale;
  double local_48;
  qreal edge;
  QPainter local_30 [8];
  QPainter p;
  qreal rgbImageSize;
  TargetImageWidget *this_local;
  QImage *allRgbTarget;
  
  QImage::QImage((QImage *)this,0x1000,0x1000,Format_RGB32);
  QPainter::QPainter(local_30,(QPaintDevice *)this);
  scale._4_4_ = QWidget::width((QWidget *)in_RSI);
  scale._0_4_ = QWidget::height((QWidget *)in_RSI);
  piVar1 = std::min<int>((int *)((long)&scale + 4),(int *)&scale);
  local_48 = (double)*piVar1;
  local_58 = 4096.0 / local_48;
  QPainter::scale(local_58,local_58);
  GetTargetRect(&local_98,in_RSI);
  local_78 = QRectF::topLeft(&local_98);
  local_68 = operator-(&local_78);
  QPainter::translate((QPointF *)local_30);
  PaintImage(in_RSI,local_30);
  QPainter::~QPainter(local_30);
  return this;
}

Assistant:

QImage TargetImageWidget::GetImageInViewTargetArea() const
{
    const qreal rgbImageSize = 4096;
    QImage allRgbTarget(rgbImageSize, rgbImageSize, QImage::Format_RGB32);

    /*
     *  Our widget isn't 4096*4096, but we've aligned our image to this widget,
     *  so now we need to further scale our painter to account for this
     *  difference.
     */
    QPainter p(&allRgbTarget);
    qreal edge = std::min(width(), height());
    qreal scale = rgbImageSize / edge;
    p.scale(scale, scale);
    p.translate(-GetTargetRect().topLeft());

    PaintImage(p);

    return allRgbTarget;
}